

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

int Cbs_ManPropagateOne(Cbs_Man_t *p,Gia_Obj_t *pVar,int Level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int Value1;
  int Value0;
  int Level_local;
  Gia_Obj_t *pVar_local;
  Cbs_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pVar);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pVar)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                  ,0x2de,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
  }
  iVar1 = Cbs_VarIsAssigned(pVar);
  if (iVar1 == 0) {
    __assert_fail("Cbs_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                  ,0x2df,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
  }
  iVar1 = Gia_ObjIsCi(pVar);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pVar);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pVar)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                    ,0x2e2,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
    }
    iVar1 = Cbs_VarFanin0Value(pVar);
    iVar2 = Cbs_VarFanin1Value(pVar);
    iVar3 = Cbs_VarValue(pVar);
    if (iVar3 == 0) {
      if ((iVar1 == 0) || (iVar2 == 0)) {
        p_local._4_4_ = 0;
      }
      else if ((iVar1 == 1) && (iVar2 == 1)) {
        pGVar4 = Gia_ObjFanin0(pVar);
        pGVar5 = Gia_ObjFanin1(pVar);
        p_local._4_4_ = Cbs_ManAnalyze(p,Level,pVar,pGVar4,pGVar5);
      }
      else if ((iVar1 == 1) || (iVar2 == 1)) {
        if (iVar1 == 2) {
          pGVar4 = Gia_ObjChild0(pVar);
          pGVar4 = Gia_Not(pGVar4);
          pGVar5 = Gia_ObjFanin1(pVar);
          Cbs_ManAssign(p,pGVar4,Level,pVar,pGVar5);
        }
        if (iVar2 == 2) {
          pGVar4 = Gia_ObjChild1(pVar);
          pGVar4 = Gia_Not(pGVar4);
          pGVar5 = Gia_ObjFanin0(pVar);
          Cbs_ManAssign(p,pGVar4,Level,pVar,pGVar5);
        }
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Cbs_VarIsJust(pVar);
        if (iVar1 == 0) {
          __assert_fail("Cbs_VarIsJust(pVar)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x303,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        iVar1 = Cbs_QueHasNode(&p->pJust,pVar);
        if (iVar1 != 0) {
          __assert_fail("!Cbs_QueHasNode( &p->pJust, pVar )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x304,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        Cbs_QuePush(&p->pJust,pVar);
        p_local._4_4_ = 0;
      }
    }
    else if ((iVar1 == 0) || (iVar2 == 0)) {
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pGVar4 = Gia_ObjFanin0(pVar);
        p_local._4_4_ = Cbs_ManAnalyze(p,Level,pVar,pGVar4,(Gia_Obj_t *)0x0);
      }
      else if ((iVar1 == 0) || (iVar2 != 0)) {
        if ((iVar1 != 0) || (iVar2 != 0)) {
          __assert_fail("Value0 == 0 && Value1 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x2ed,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        pGVar4 = Gia_ObjFanin0(pVar);
        pGVar5 = Gia_ObjFanin1(pVar);
        p_local._4_4_ = Cbs_ManAnalyze(p,Level,pVar,pGVar4,pGVar5);
      }
      else {
        pGVar4 = Gia_ObjFanin1(pVar);
        p_local._4_4_ = Cbs_ManAnalyze(p,Level,pVar,pGVar4,(Gia_Obj_t *)0x0);
      }
    }
    else {
      if (iVar1 == 2) {
        pGVar4 = Gia_ObjChild0(pVar);
        Cbs_ManAssign(p,pGVar4,Level,pVar,(Gia_Obj_t *)0x0);
      }
      if (iVar2 == 2) {
        pGVar4 = Gia_ObjChild1(pVar);
        Cbs_ManAssign(p,pGVar4,Level,pVar,(Gia_Obj_t *)0x0);
      }
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Cbs_ManPropagateOne( Cbs_Man_t * p, Gia_Obj_t * pVar, int Level )
{
    int Value0, Value1;
    assert( !Gia_IsComplement(pVar) );
    assert( Cbs_VarIsAssigned(pVar) );
    if ( Gia_ObjIsCi(pVar) )
        return 0;
    assert( Gia_ObjIsAnd(pVar) );
    Value0 = Cbs_VarFanin0Value(pVar);
    Value1 = Cbs_VarFanin1Value(pVar);
    if ( Cbs_VarValue(pVar) )
    { // value is 1
        if ( Value0 == 0 || Value1 == 0 ) // one is 0
        {
            if ( Value0 == 0 && Value1 != 0 )
                return Cbs_ManAnalyze( p, Level, pVar, Gia_ObjFanin0(pVar), NULL );
            if ( Value0 != 0 && Value1 == 0 )
                return Cbs_ManAnalyze( p, Level, pVar, Gia_ObjFanin1(pVar), NULL );
            assert( Value0 == 0 && Value1 == 0 );
            return Cbs_ManAnalyze( p, Level, pVar, Gia_ObjFanin0(pVar), Gia_ObjFanin1(pVar) );
        }
        if ( Value0 == 2 ) // first is unassigned
            Cbs_ManAssign( p, Gia_ObjChild0(pVar), Level, pVar, NULL );
        if ( Value1 == 2 ) // first is unassigned
            Cbs_ManAssign( p, Gia_ObjChild1(pVar), Level, pVar, NULL );
        return 0;
    }
    // value is 0
    if ( Value0 == 0 || Value1 == 0 ) // one is 0
        return 0;
    if ( Value0 == 1 && Value1 == 1 ) // both are 1
        return Cbs_ManAnalyze( p, Level, pVar, Gia_ObjFanin0(pVar), Gia_ObjFanin1(pVar) );
    if ( Value0 == 1 || Value1 == 1 ) // one is 1 
    {
        if ( Value0 == 2 ) // first is unassigned
            Cbs_ManAssign( p, Gia_Not(Gia_ObjChild0(pVar)), Level, pVar, Gia_ObjFanin1(pVar) );
        if ( Value1 == 2 ) // second is unassigned
            Cbs_ManAssign( p, Gia_Not(Gia_ObjChild1(pVar)), Level, pVar, Gia_ObjFanin0(pVar) );
        return 0;
    }
    assert( Cbs_VarIsJust(pVar) );
    assert( !Cbs_QueHasNode( &p->pJust, pVar ) );
    Cbs_QuePush( &p->pJust, pVar );
    return 0;
}